

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_klass_table.hpp
# Opt level: O0

int __thiscall squall::detail::KlassImp<Foo>::close(KlassImp<Foo> *this,int __fd)

{
  HSQOBJECT obj;
  KlassImp<Foo> *extraout_RAX;
  SQBool in_stack_ffffffffffffffc8;
  HSQUIRRELVM in_stack_ffffffffffffffd0;
  HSQUIRRELVM in_stack_ffffffffffffffd8;
  SQObjectValue in_stack_ffffffffffffffe0;
  keeper k;
  KlassImp<Foo> *this_local;
  
  if ((this->closed_ & 1U) == 0) {
    keeper::keeper((keeper *)&stack0xffffffffffffffe0,this->vm_);
    sq_pushroottable((HSQUIRRELVM)0x109e5d);
    std::__cxx11::string::c_str();
    sq_pushstring((HSQUIRRELVM)in_stack_ffffffffffffffe0.pTable,(SQChar *)in_stack_ffffffffffffffd8,
                  (SQInteger)in_stack_ffffffffffffffd0);
    obj._unVal.pTable = in_stack_ffffffffffffffe0.pTable;
    obj._0_8_ = in_stack_ffffffffffffffd8;
    sq_pushobject(in_stack_ffffffffffffffd0,obj);
    sq_newslot(in_stack_ffffffffffffffd8,(SQInteger)in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffc8);
    this->closed_ = true;
    keeper::~keeper((keeper *)&stack0xffffffffffffffe0);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void close() {
        if (closed_) { return; }

        keeper k(vm_);
        sq_pushroottable(vm_);
        sq_pushstring(vm_, name_.c_str(), -1);
        sq_pushobject(vm_, sqclass_);
        sq_createslot(vm_, -3);

        closed_ = true;
    }